

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O0

bool __thiscall
sptk::SymmetricMatrix::CholeskyDecomposition
          (SymmetricMatrix *this,SymmetricMatrix *lower_triangular_matrix,
          vector<double,_std::allocator<double>_> *diagonal_elements)

{
  double dVar1;
  const_reference ppdVar2;
  size_type sVar3;
  reference pvVar4;
  reference ppdVar5;
  vector<double,_std::allocator<double>_> *in_RDX;
  size_type in_RSI;
  size_type in_RDI;
  int j_1;
  int k;
  double tmp;
  int j;
  int i;
  double *d;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar6;
  double local_38;
  int local_30;
  int local_2c;
  
  if (((in_RSI != 0) && (in_RDX != (vector<double,_std::allocator<double>_> *)0x0)) &&
     (in_RDI != in_RSI)) {
    ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                        ((vector<double_*,_std::allocator<double_*>_> *)(in_RDI + 0x28),0);
    if ((**ppdVar2 != 0.0) || (NAN(**ppdVar2))) {
      if (*(int *)(in_RSI + 8) != *(int *)(in_RDI + 8)) {
        Resize((SymmetricMatrix *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (int)(in_RDI >> 0x20));
      }
      sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
      if (sVar3 != (long)*(int *)(in_RDI + 8)) {
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
      ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                          ((vector<double_*,_std::allocator<double_*>_> *)(in_RDI + 0x28),0);
      *pvVar4 = **ppdVar2;
      ppdVar5 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                          ((vector<double_*,_std::allocator<double_*>_> *)(in_RSI + 0x28),0);
      **ppdVar5 = 1.0;
      local_2c = 1;
      while( true ) {
        if (*(int *)(in_RDI + 8) <= local_2c) {
          return true;
        }
        for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
          ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                              ((vector<double_*,_std::allocator<double_*>_> *)(in_RDI + 0x28),
                               (long)local_2c);
          local_38 = (*ppdVar2)[local_30];
          for (iVar6 = 0; iVar6 < local_30; iVar6 = iVar6 + 1) {
            ppdVar5 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                                ((vector<double_*,_std::allocator<double_*>_> *)(in_RSI + 0x28),
                                 (long)local_2c);
            dVar1 = (*ppdVar5)[iVar6];
            ppdVar5 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                                ((vector<double_*,_std::allocator<double_*>_> *)(in_RSI + 0x28),
                                 (long)local_30);
            local_38 = -(dVar1 * (*ppdVar5)[iVar6]) * pvVar4[iVar6] + local_38;
          }
          dVar1 = pvVar4[local_30];
          ppdVar5 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                              ((vector<double_*,_std::allocator<double_*>_> *)(in_RSI + 0x28),
                               (long)local_2c);
          (*ppdVar5)[local_30] = local_38 / dVar1;
        }
        ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                            ((vector<double_*,_std::allocator<double_*>_> *)(in_RDI + 0x28),
                             (long)local_2c);
        pvVar4[local_2c] = (*ppdVar2)[local_2c];
        for (iVar6 = 0; iVar6 < local_2c; iVar6 = iVar6 + 1) {
          ppdVar5 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                              ((vector<double_*,_std::allocator<double_*>_> *)(in_RSI + 0x28),
                               (long)local_2c);
          dVar1 = (*ppdVar5)[iVar6];
          ppdVar5 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                              ((vector<double_*,_std::allocator<double_*>_> *)(in_RSI + 0x28),
                               (long)local_2c);
          pvVar4[local_2c] = -(dVar1 * (*ppdVar5)[iVar6]) * pvVar4[iVar6] + pvVar4[local_2c];
        }
        if (ABS(pvVar4[local_2c]) <= 1e-12) break;
        ppdVar5 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                            ((vector<double_*,_std::allocator<double_*>_> *)(in_RSI + 0x28),
                             (long)local_2c);
        (*ppdVar5)[local_2c] = 1.0;
        local_2c = local_2c + 1;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool SymmetricMatrix::CholeskyDecomposition(
    SymmetricMatrix* lower_triangular_matrix,
    std::vector<double>* diagonal_elements) const {
  if (NULL == lower_triangular_matrix || NULL == diagonal_elements ||
      this == lower_triangular_matrix || 0.0 == index_[0][0]) {
    return false;
  }

  if (lower_triangular_matrix->num_dimension_ != num_dimension_) {
    lower_triangular_matrix->Resize(num_dimension_);
  }
  if (diagonal_elements->size() != static_cast<std::size_t>(num_dimension_)) {
    diagonal_elements->resize(num_dimension_);
  }

  double* d(&((*diagonal_elements)[0]));

  d[0] = index_[0][0];
  lower_triangular_matrix->index_[0][0] = 1.0;
  for (int i(1); i < num_dimension_; ++i) {
    for (int j(0); j < i; ++j) {
      double tmp(index_[i][j]);
      for (int k(0); k < j; ++k) {
        tmp -= lower_triangular_matrix->index_[i][k] *
               lower_triangular_matrix->index_[j][k] * d[k];
      }
      lower_triangular_matrix->index_[i][j] = tmp / d[j];
    }

    d[i] = index_[i][i];
    for (int j(0); j < i; ++j) {
      d[i] -= lower_triangular_matrix->index_[i][j] *
              lower_triangular_matrix->index_[i][j] * d[j];
    }
    if (std::fabs(d[i]) <= kMinimumValueOfDiagonalElement) {
      return false;
    }
    lower_triangular_matrix->index_[i][i] = 1.0;
  }
  return true;
}